

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

boolean clear_stale_map(char oclass,uint material)

{
  boolean bVar1;
  undefined1 local_19;
  undefined4 local_18;
  int iStack_14;
  boolean change_made;
  int zy;
  int zx;
  uint material_local;
  char oclass_local;
  
  local_19 = '\0';
  for (iStack_14 = 1; iStack_14 < 0x50; iStack_14 = iStack_14 + 1) {
    for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
      bVar1 = check_map_spot(iStack_14,local_18,oclass,material);
      if (bVar1 != '\0') {
        unmap_object(iStack_14,local_18);
        local_19 = '\x01';
      }
    }
  }
  return local_19;
}

Assistant:

static boolean clear_stale_map(char oclass, unsigned material)
{
	int zx, zy;
	boolean change_made = FALSE;

	for (zx = 1; zx < COLNO; zx++)
	    for (zy = 0; zy < ROWNO; zy++)
		if (check_map_spot(zx, zy, oclass,material)) {
		    unmap_object(zx, zy);
		    change_made = TRUE;
		}

	return change_made;
}